

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_object.c
# Opt level: O0

void assert_is_object(cJSON *object_item)

{
  cJSON *object_item_local;
  
  if (object_item == (cJSON *)0x0) {
    UnityFail("Item is NULL.",0x23);
  }
  if (object_item->next != (cJSON *)0x0) {
    UnityFail("Linked list next pointer is not NULL.",0x25);
  }
  if (object_item->prev != (cJSON *)0x0) {
    UnityFail("Linked list previous pointer is not NULL.",0x25);
  }
  UnityAssertBits(0xff,0x40,(long)object_item->type,"Item doesn\'t have expected type.",0x26);
  UnityAssertBits(0x100,0,(long)object_item->type,"Item should not have a string as reference.",0x27
                 );
  UnityAssertBits(0x200,0,(long)object_item->type,"Item should not have a const string.",0x28);
  if (object_item->valuestring != (char *)0x0) {
    UnityFail("Valuestring is not NULL.",0x29);
  }
  if (object_item->string != (char *)0x0) {
    UnityFail("String is not NULL.",0x2a);
  }
  return;
}

Assistant:

static void assert_is_object(cJSON *object_item)
{
    TEST_ASSERT_NOT_NULL_MESSAGE(object_item, "Item is NULL.");

    assert_not_in_list(object_item);
    assert_has_type(object_item, cJSON_Object);
    assert_has_no_reference(object_item);
    assert_has_no_const_string(object_item);
    assert_has_no_valuestring(object_item);
    assert_has_no_string(object_item);
}